

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

void update_buffer_level(AV1_COMP *cpi,int encoded_frame_size)

{
  aom_tune_content aVar1;
  int iVar2;
  AV1_PRIMARY *pAVar3;
  long lVar4;
  LAYER_CONTEXT *pLVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  
  pAVar3 = cpi->ppi;
  if ((cpi->common).show_frame == 0) {
    lVar7 = (pAVar3->p_rc).bits_off_target - (long)encoded_frame_size;
  }
  else {
    lVar7 = ((long)(cpi->rc).avg_frame_bandwidth - (long)encoded_frame_size) +
            (pAVar3->p_rc).bits_off_target;
  }
  lVar4 = (pAVar3->p_rc).maximum_buffer_size;
  if (lVar4 <= lVar7) {
    lVar7 = lVar4;
  }
  (pAVar3->p_rc).bits_off_target = lVar7;
  aVar1 = (cpi->oxcf).tune_cfg.content;
  if (aVar1 == AOM_CONTENT_SCREEN) {
    lVar9 = -lVar4;
    if (lVar7 == lVar9 || SBORROW8(lVar7,lVar9) != lVar7 + lVar4 < 0) {
      lVar7 = lVar9;
    }
    (pAVar3->p_rc).bits_off_target = lVar7;
  }
  (pAVar3->p_rc).buffer_level = lVar7;
  if (pAVar3->use_svc != 0) {
    lVar7 = (long)(cpi->svc).temporal_layer_id;
    iVar2 = (cpi->svc).number_temporal_layers;
    while (lVar7 = lVar7 + 1, (int)lVar7 < iVar2) {
      pLVar5 = (cpi->svc).layer_context;
      lVar6 = (long)(cpi->svc).spatial_layer_id * (long)iVar2 + lVar7;
      dVar10 = round((double)pLVar5[lVar6].target_bandwidth / pLVar5[lVar6].framerate);
      lVar9 = (long)((int)dVar10 - encoded_frame_size) + pLVar5[lVar6].p_rc.bits_off_target;
      lVar4 = pLVar5[lVar6].p_rc.maximum_buffer_size;
      if (lVar4 <= lVar9) {
        lVar9 = lVar4;
      }
      pLVar5[lVar6].p_rc.bits_off_target = lVar9;
      pLVar5[lVar6].p_rc.buffer_level = lVar9;
      if (aVar1 == AOM_CONTENT_SCREEN) {
        lVar8 = -lVar4;
        if (lVar9 != lVar8 && SBORROW8(lVar9,lVar8) == lVar9 + lVar4 < 0) {
          lVar8 = lVar9;
        }
        pLVar5[lVar6].p_rc.bits_off_target = lVar8;
        pLVar5[lVar6].p_rc.buffer_level = lVar8;
      }
    }
  }
  return;
}

Assistant:

static void update_buffer_level(AV1_COMP *cpi, int encoded_frame_size) {
  const AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;

  // Non-viewable frames are a special case and are treated as pure overhead.
  if (!cm->show_frame)
    p_rc->bits_off_target -= encoded_frame_size;
  else
    p_rc->bits_off_target += rc->avg_frame_bandwidth - encoded_frame_size;

  // Clip the buffer level to the maximum specified buffer size.
  p_rc->bits_off_target =
      AOMMIN(p_rc->bits_off_target, p_rc->maximum_buffer_size);
  // For screen-content mode: don't let buffer level go below threshold,
  // given here as -rc->maximum_ buffer_size, to allow buffer to come back
  // up sooner after slide change with big overshoot.
  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN)
    p_rc->bits_off_target =
        AOMMAX(p_rc->bits_off_target, -p_rc->maximum_buffer_size);
  p_rc->buffer_level = p_rc->bits_off_target;

  if (cpi->ppi->use_svc)
    update_layer_buffer_level(&cpi->svc, encoded_frame_size,
                              cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN);

#if CONFIG_FPMT_TEST
  /* The variable temp_buffer_level is introduced for quality
   * simulation purpose, it retains the value previous to the parallel
   * encode frames. The variable is updated based on the update flag.
   *
   * If there exist show_existing_frames between parallel frames, then to
   * retain the temp state do not update it. */
  int show_existing_between_parallel_frames =
      (cpi->ppi->gf_group.update_type[cpi->gf_frame_index] ==
           INTNL_OVERLAY_UPDATE &&
       cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index + 1] == 2);

  if (cpi->do_frame_data_update && !show_existing_between_parallel_frames &&
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) {
    p_rc->temp_buffer_level = p_rc->buffer_level;
  }
#endif
}